

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmMove3<(moira::Instr)71,(moira::Mode)5,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  Ea<(moira::Mode)5,_1> src;
  Ea<(moira::Mode)3,_1> dst;
  u32 local_40;
  ushort local_3c;
  uint local_38;
  u32 local_2c;
  ushort local_28;
  
  local_3c = op & 7;
  local_40 = *addr;
  *addr = local_40 + 2;
  local_38 = (*this->_vptr_Moira[6])();
  local_38 = local_38 & 0xffff;
  local_28 = op >> 9 & 7;
  local_2c = *addr;
  cVar4 = 'm';
  lVar5 = 0;
  do {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar4;
    cVar4 = "fdmove"[lVar5 + 3];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = 'b';
  }
  else {
    cVar4 = '.';
    lVar5 = 0;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = ".b"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar3 = str->ptr;
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)5,_1> *)&local_40);
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)3,_1> *)&local_2c);
  return;
}

Assistant:

void
Moira::dasmMove3(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <Mode::PI,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}